

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_create_boot_catalog(archive_write *a,isoent *rootent)

{
  archive_entry *paVar1;
  __uid_t _Var2;
  __gid_t _Var3;
  int iVar4;
  int64_t iVar5;
  char *pcVar6;
  archive_entry *entry;
  isoent *isoent;
  isofile *file;
  iso9660_conflict *iso9660;
  isoent *rootent_local;
  archive_write *a_local;
  
  file = (isofile *)a->format_data;
  iso9660 = (iso9660_conflict *)rootent;
  rootent_local = (isoent *)a;
  isoent = (isoent *)isofile_new(a,(archive_entry *)0x0);
  if (isoent == (isoent *)0x0) {
    archive_set_error((archive *)rootent_local,0xc,"Can\'t allocate memory");
    a_local._4_4_ = -0x1e;
  }
  else {
    archive_entry_set_pathname((archive_entry *)isoent->parent,file[0x14b].symlink.s);
    archive_entry_set_size((archive_entry *)isoent->parent,0x800);
    archive_entry_set_mtime((archive_entry *)isoent->parent,(time_t)file->allnext,0);
    archive_entry_set_atime((archive_entry *)isoent->parent,(time_t)file->allnext,0);
    archive_entry_set_ctime((archive_entry *)isoent->parent,(time_t)file->allnext,0);
    paVar1 = (archive_entry *)isoent->parent;
    _Var2 = getuid();
    archive_entry_set_uid(paVar1,(ulong)_Var2);
    paVar1 = (archive_entry *)isoent->parent;
    _Var3 = getgid();
    archive_entry_set_gid(paVar1,(ulong)_Var3);
    archive_entry_set_mode((archive_entry *)isoent->parent,0x8124);
    archive_entry_set_nlink((archive_entry *)isoent->parent,1);
    iVar4 = isofile_gen_utility_names((archive_write *)rootent_local,(isofile *)isoent);
    if (iVar4 < -0x14) {
      isofile_free((isofile *)isoent);
      a_local._4_4_ = -0x1e;
    }
    else {
      isoent->mb_len = 1;
      *(undefined8 *)&(isoent->dr_len).normal = 0x800;
      isofile_add_entry((iso9660_conflict *)file,(isofile *)isoent);
      entry = (archive_entry *)isoent_new((isofile *)isoent);
      if (entry == (archive_entry *)0x0) {
        archive_set_error((archive *)rootent_local,0xc,"Can\'t allocate memory");
        a_local._4_4_ = -0x1e;
      }
      else {
        *(byte *)&(entry->ae_fflags_text).aes_utf8.length =
             (byte)(entry->ae_fflags_text).aes_utf8.length & 0xfe | 1;
        iVar4 = isoent_tree((archive_write *)rootent_local,(isoent **)&entry);
        if (iVar4 == 0) {
          *(archive_entry **)&file[0x14b].dircnt = entry;
          switch(*(uint *)&file[0x14c].hlnext >> 9 & 3) {
          default:
            paVar1 = (archive_entry *)(file[0x14b].content.next)->next[1].offset_of_temp;
            iVar5 = archive_entry_size(paVar1);
            if (iVar5 == 0x12c000) {
              *(undefined1 *)&file[0x14c].datanext = 1;
            }
            else {
              iVar5 = archive_entry_size(paVar1);
              if (iVar5 == 0x168000) {
                *(undefined1 *)&file[0x14c].datanext = 2;
              }
              else {
                pcVar6 = (char *)archive_entry_size(paVar1);
                if (pcVar6 == 
                    "istFileArgumentSt6vectorIS1_SaIS1_EEEENS_17__normal_iteratorIT_T0_E15difference_typeERKS9_SC_"
                   ) {
                  *(undefined1 *)&file[0x14c].datanext = 3;
                }
                else {
                  *(undefined1 *)&file[0x14c].datanext = 0;
                }
              }
            }
            break;
          case 1:
            *(undefined1 *)&file[0x14c].datanext = 0;
            break;
          case 2:
            paVar1 = (archive_entry *)(file[0x14b].content.next)->next[1].offset_of_temp;
            iVar5 = archive_entry_size(paVar1);
            if (iVar5 < 0x12c001) {
              *(undefined1 *)&file[0x14c].datanext = 1;
            }
            else {
              iVar5 = archive_entry_size(paVar1);
              if (iVar5 < 0x168001) {
                *(undefined1 *)&file[0x14c].datanext = 2;
              }
              else {
                iVar5 = archive_entry_size(paVar1);
                if (0x2d0000 < iVar5) {
                  archive_set_error((archive *)rootent_local,-1,
                                    "Boot image file(``%s\'\') size is too big for fd type.",
                                    file[0x14b].content.offset_of_temp);
                  return -0x1e;
                }
                *(undefined1 *)&file[0x14c].datanext = 3;
              }
            }
            break;
          case 3:
            *(undefined1 *)&file[0x14c].datanext = 4;
          }
          *(undefined1 *)((long)&file[0x14c].datanext + 1) = 0;
          if ((*(uint *)&file[0x14c].hlnext >> 0x16 & 1) != 0) {
            file[0x14b].zisofs.header_size = '\0';
            file[0x14b].zisofs.log2_bs = '\0';
            *(undefined2 *)&file[0x14b].zisofs.field_0x2 = 0;
            file[0x14b].zisofs.uncompressed_size = 0;
            archive_string_concat
                      ((archive_string *)&file[0x14b].write_content,
                       (archive_string *)&file[1].symlink.length);
          }
          a_local._4_4_ = 0;
        }
        else {
          a_local._4_4_ = -0x1e;
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
isoent_create_boot_catalog(struct archive_write *a, struct isoent *rootent)
{
	struct iso9660 *iso9660 = a->format_data;
	struct isofile *file;
	struct isoent *isoent;
	struct archive_entry *entry;

	(void)rootent; /* UNUSED */
	/*
	 * Create the entry which is the "boot.catalog" file.
	 */
	file = isofile_new(a, NULL);
	if (file == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	archive_entry_set_pathname(file->entry,
	    iso9660->el_torito.catalog_filename.s);
	archive_entry_set_size(file->entry, LOGICAL_BLOCK_SIZE);
	archive_entry_set_mtime(file->entry, iso9660->birth_time, 0);
	archive_entry_set_atime(file->entry, iso9660->birth_time, 0);
	archive_entry_set_ctime(file->entry, iso9660->birth_time, 0);
	archive_entry_set_uid(file->entry, getuid());
	archive_entry_set_gid(file->entry, getgid());
	archive_entry_set_mode(file->entry, AE_IFREG | 0444);
	archive_entry_set_nlink(file->entry, 1);

	if (isofile_gen_utility_names(a, file) < ARCHIVE_WARN) {
		isofile_free(file);
		return (ARCHIVE_FATAL);
	}
	file->boot = BOOT_CATALOG;
	file->content.size = LOGICAL_BLOCK_SIZE;
	isofile_add_entry(iso9660, file);

	isoent = isoent_new(file);
	if (isoent == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	isoent->virtual = 1;

	/* Add the "boot.catalog" entry into tree */
	if (isoent_tree(a, &isoent) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	iso9660->el_torito.catalog = isoent;
	/*
	 * Get a boot medai type.
	 */
	switch (iso9660->opt.boot_type) {
	default:
	case OPT_BOOT_TYPE_AUTO:
		/* Try detecting a media type of the boot image. */
		entry = iso9660->el_torito.boot->file->entry;
		if (archive_entry_size(entry) == FD_1_2M_SIZE)
			iso9660->el_torito.media_type =
			    BOOT_MEDIA_1_2M_DISKETTE;
		else if (archive_entry_size(entry) == FD_1_44M_SIZE)
			iso9660->el_torito.media_type =
			    BOOT_MEDIA_1_44M_DISKETTE;
		else if (archive_entry_size(entry) == FD_2_88M_SIZE)
			iso9660->el_torito.media_type =
			    BOOT_MEDIA_2_88M_DISKETTE;
		else
			/* We cannot decide whether the boot image is
			 * hard-disk. */
			iso9660->el_torito.media_type =
			    BOOT_MEDIA_NO_EMULATION;
		break;
	case OPT_BOOT_TYPE_NO_EMU:
		iso9660->el_torito.media_type = BOOT_MEDIA_NO_EMULATION;
		break;
	case OPT_BOOT_TYPE_HARD_DISK:
		iso9660->el_torito.media_type = BOOT_MEDIA_HARD_DISK;
		break;
	case OPT_BOOT_TYPE_FD:
		entry = iso9660->el_torito.boot->file->entry;
		if (archive_entry_size(entry) <= FD_1_2M_SIZE)
			iso9660->el_torito.media_type =
			    BOOT_MEDIA_1_2M_DISKETTE;
		else if (archive_entry_size(entry) <= FD_1_44M_SIZE)
			iso9660->el_torito.media_type =
			    BOOT_MEDIA_1_44M_DISKETTE;
		else if (archive_entry_size(entry) <= FD_2_88M_SIZE)
			iso9660->el_torito.media_type =
			    BOOT_MEDIA_2_88M_DISKETTE;
		else {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Boot image file(``%s'') size is too big "
			    "for fd type.",
			    iso9660->el_torito.boot_filename.s);
			return (ARCHIVE_FATAL);
		}
		break;
	}

	/*
	 * Get a system type.
	 * TODO: `El Torito' specification says "A copy of byte 5 from the
	 *       Partition Table found in the boot image".
	 */
	iso9660->el_torito.system_type = 0;

	/*
	 * Get an ID.
	 */
	if (iso9660->opt.publisher)
		archive_string_copy(&(iso9660->el_torito.id),
		    &(iso9660->publisher_identifier));


	return (ARCHIVE_OK);
}